

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzstrmatrixor.cpp
# Opt level: O0

void __thiscall
TPZStructMatrixOR<double>::MultiThread_Assemble
          (TPZStructMatrixOR<double> *this,TPZBaseMatrix *rhs,
          TPZAutoPointer<TPZGuiInterface> *guiInterface)

{
  undefined1 uVar1;
  undefined1 uVar2;
  TPZStructMatrix *this_00;
  TPZStructMatrix *strmat;
  TPZGuiInterface *this_01;
  TPZAutoPointer *in_RDX;
  TPZBaseMatrix *in_RSI;
  long *in_RDI;
  int itr;
  vector<std::thread,_std::allocator<std::thread>_> allthreads;
  int numthreads;
  ThreadData threaddata;
  TPZStructMatrix *myself;
  value_type *in_stack_fffffffffffffe28;
  undefined7 in_stack_fffffffffffffe30;
  undefined1 in_stack_fffffffffffffe37;
  undefined8 in_stack_fffffffffffffe38;
  undefined7 in_stack_fffffffffffffe40;
  undefined1 in_stack_fffffffffffffe47;
  undefined7 in_stack_fffffffffffffe60;
  TPZStructMatrix *__f;
  int local_16c;
  vector<std::thread,_std::allocator<std::thread>_> local_168;
  int local_150;
  TPZStructMatrix *threaddata_00;
  
  uVar2 = (undefined1)((ulong)in_stack_fffffffffffffe38 >> 0x38);
  if (in_RDI == (long *)0x0) {
    this_00 = (TPZStructMatrix *)0x0;
  }
  else {
    this_00 = (TPZStructMatrix *)
              __dynamic_cast(in_RDI,&typeinfo,&::TPZStructMatrix::typeinfo,0xfffffffffffffffe);
  }
  __f = this_00;
  threaddata_00 = this_00;
  strmat = (TPZStructMatrix *)::TPZStructMatrix::MaterialIds(this_00);
  TPZAutoPointer<TPZGuiInterface>::TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)
             CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
             (TPZAutoPointer<TPZGuiInterface> *)in_stack_fffffffffffffe28);
  uVar1 = TPZStrMatParInterface::ComputeRhs
                    ((TPZStrMatParInterface *)((long)in_RDI + *(long *)(*in_RDI + -0x60)));
  ThreadData::ThreadData
            ((ThreadData *)CONCAT17(uVar1,in_stack_fffffffffffffe60),strmat,in_RSI,
             (set<int,_std::less<int>,_std::allocator<int>_> *)this_00,
             (TPZAutoPointer<TPZGuiInterface> *)
             CONCAT17(in_stack_fffffffffffffe47,in_stack_fffffffffffffe40),(bool)uVar2);
  TPZAutoPointer<TPZGuiInterface>::~TPZAutoPointer
            ((TPZAutoPointer<TPZGuiInterface> *)
             CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  local_150 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x60) + 8);
  std::vector<std::thread,_std::allocator<std::thread>_>::vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)0x1d73d33);
  uVar2 = ::TPZAutoPointer::operator_cast_to_bool(in_RDX);
  if ((bool)uVar2) {
    this_01 = TPZAutoPointer<TPZGuiInterface>::operator->((TPZAutoPointer<TPZGuiInterface> *)in_RDX)
    ;
    in_stack_fffffffffffffe37 = TPZGuiInterface::AmIKilled(this_01);
    if ((bool)in_stack_fffffffffffffe37) goto LAB_01d73e9c;
  }
  for (local_16c = 0; local_16c < local_150; local_16c = local_16c + 1) {
    std::thread::thread<void*(&)(void*),TPZStructMatrixOR<double>::ThreadData*,void>
              ((thread *)in_RDX,(_func_void_ptr_void_ptr *)__f,
               (ThreadData **)CONCAT17(uVar1,in_stack_fffffffffffffe60));
    std::vector<std::thread,_std::allocator<std::thread>_>::push_back
              ((vector<std::thread,_std::allocator<std::thread>_> *)
               CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30),
               in_stack_fffffffffffffe28);
    std::thread::~thread((thread *)0x1d73e1b);
  }
  ThreadData::ThreadAssembly(threaddata_00);
  for (local_16c = 0; local_16c < local_150; local_16c = local_16c + 1) {
    std::vector<std::thread,_std::allocator<std::thread>_>::operator[](&local_168,(long)local_16c);
    std::thread::join();
  }
LAB_01d73e9c:
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)
             CONCAT17(uVar2,in_stack_fffffffffffffe40));
  ThreadData::~ThreadData
            ((ThreadData *)CONCAT17(in_stack_fffffffffffffe37,in_stack_fffffffffffffe30));
  return;
}

Assistant:

void
TPZStructMatrixOR<TVar>::MultiThread_Assemble(TPZBaseMatrix & rhs, TPZAutoPointer<TPZGuiInterface> guiInterface) {
    auto *myself = dynamic_cast<TPZStructMatrix*>(this);
    ThreadData threaddata(myself, rhs, myself->MaterialIds(), guiInterface,ComputeRhs());
    const int numthreads = this->fNumThreads;
    std::vector<std::thread> allthreads;
    int itr;
    if (guiInterface) {
        if (guiInterface->AmIKilled()) {
            return;
        }
    }

    for (itr = 0; itr < numthreads; itr++) {
      allthreads.push_back(std::thread(ThreadData::ThreadWork, &threaddata));
    }

    ThreadData::ThreadAssembly(&threaddata);

    for (itr = 0; itr < numthreads; itr++) {
      allthreads[itr].join();
    }
}